

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_obj.cc
# Opt level: O0

char * X509_NAME_oneline(X509_NAME *a,char *buf,int size)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  size_t sVar8;
  X509_NAME_ENTRY *pXVar9;
  size_t sVar10;
  undefined4 extraout_var_00;
  uchar *puVar11;
  char local_d8 [8];
  char tmp_buf [80];
  int gs_doit [4];
  BUF_MEM *b;
  uchar *q;
  char *p;
  char *s;
  int type;
  int j;
  int num;
  int l2;
  int l1;
  int l;
  int lold;
  int n;
  size_t i;
  X509_NAME_ENTRY *ne;
  X509_NAME *pXStack_20;
  int len_local;
  char *buf_local;
  X509_NAME *a_local;
  
  gs_doit[2] = 0;
  gs_doit[3] = 0;
  if (buf == (char *)0x0) {
    gs_doit._8_8_ = BUF_MEM_new();
    if (((BUF_MEM *)gs_doit._8_8_ == (BUF_MEM *)0x0) ||
       (iVar4 = BUF_MEM_grow((BUF_MEM *)gs_doit._8_8_,200), CONCAT44(extraout_var,iVar4) == 0)) {
LAB_004c31e8:
      BUF_MEM_free((BUF_MEM *)gs_doit._8_8_);
      return (char *)0x0;
    }
    *((BUF_MEM *)gs_doit._8_8_)->data = '\0';
    ne._4_4_ = 200;
  }
  else {
    ne._4_4_ = size;
    if (size < 1) {
      return (char *)0x0;
    }
  }
  if (a == (X509_NAME *)0x0) {
    pXStack_20 = (X509_NAME *)buf;
    if (gs_doit._8_8_ != 0) {
      pXStack_20 = *(X509_NAME **)(gs_doit._8_8_ + 8);
      OPENSSL_free((void *)gs_doit._8_8_);
    }
    OPENSSL_strlcpy((char *)pXStack_20,"NO X509_NAME",(long)ne._4_4_);
    a_local = pXStack_20;
  }
  else {
    l2 = 0;
    for (_lold = 0; sVar8 = sk_X509_NAME_ENTRY_num((stack_st_X509_NAME_ENTRY *)a->entries),
        _lold < sVar8; _lold = _lold + 1) {
      pXVar9 = sk_X509_NAME_ENTRY_value((stack_st_X509_NAME_ENTRY *)a->entries,_lold);
      iVar4 = OBJ_obj2nid((ASN1_OBJECT *)pXVar9->object);
      if ((iVar4 == 0) || (p = OBJ_nid2sn(iVar4), p == (char *)0x0)) {
        i2t_ASN1_OBJECT(local_d8,0x50,(ASN1_OBJECT *)pXVar9->object);
        p = local_d8;
      }
      sVar10 = strlen(p);
      iVar4 = pXVar9->value->length;
      if (0x100000 < iVar4) {
        ERR_put_error(0xb,0,0x87,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_obj.cc"
                      ,0x4f);
        goto LAB_004c31e8;
      }
      puVar11 = pXVar9->value->data;
      if ((pXVar9->value->type == 0x1b) && (iVar4 % 4 == 0)) {
        tmp_buf[0x4c] = '\0';
        tmp_buf[0x4d] = '\0';
        tmp_buf[0x4e] = '\0';
        tmp_buf[0x4f] = '\0';
        tmp_buf[0x48] = '\0';
        tmp_buf[0x49] = '\0';
        tmp_buf[0x4a] = '\0';
        tmp_buf[0x4b] = '\0';
        for (s._4_4_ = 0; (int)s._4_4_ < iVar4; s._4_4_ = s._4_4_ + 1) {
          if (puVar11[(int)s._4_4_] != '\0') {
            gs_doit[(long)(int)(s._4_4_ & 3) + -2] = 1;
          }
        }
        bVar2 = tmp_buf._72_4_ == 0;
        bVar3 = tmp_buf._76_4_ == 0;
        if (bVar2 && bVar3) {
          tmp_buf[0x4c] = '\0';
          tmp_buf[0x4d] = '\0';
          tmp_buf[0x4e] = '\0';
          tmp_buf[0x4f] = '\0';
          tmp_buf[0x48] = '\0';
          tmp_buf[0x49] = '\0';
          tmp_buf[0x4a] = '\0';
          tmp_buf[0x4b] = '\0';
        }
        else {
          tmp_buf[0x4c] = '\x01';
          tmp_buf[0x4d] = '\0';
          tmp_buf[0x4e] = '\0';
          tmp_buf[0x4f] = '\0';
          tmp_buf[0x48] = '\x01';
          tmp_buf[0x49] = '\0';
          tmp_buf[0x4a] = '\0';
          tmp_buf[0x4b] = '\0';
        }
        tmp_buf[0x4d] = '\0';
        tmp_buf[0x4e] = '\0';
        tmp_buf[0x4f] = '\0';
        tmp_buf[0x4c] = !bVar2 || !bVar3;
        tmp_buf[0x49] = '\0';
        tmp_buf[0x4a] = '\0';
        tmp_buf[0x4b] = '\0';
        tmp_buf[0x48] = !bVar2 || !bVar3;
      }
      else {
        tmp_buf[0x4c] = '\x01';
        tmp_buf[0x4d] = '\0';
        tmp_buf[0x4e] = '\0';
        tmp_buf[0x4f] = '\0';
        tmp_buf[0x48] = '\x01';
        tmp_buf[0x49] = '\0';
        tmp_buf[0x4a] = '\0';
        tmp_buf[0x4b] = '\0';
      }
      j = 0;
      for (s._4_4_ = 0; (int)s._4_4_ < iVar4; s._4_4_ = s._4_4_ + 1) {
        iVar5 = j;
        if ((gs_doit[(long)(int)(s._4_4_ & 3) + -2] != 0) &&
           ((puVar11[(int)s._4_4_] < 0x20 || (iVar5 = j + 1, 0x7e < puVar11[(int)s._4_4_])))) {
          iVar5 = j + 4;
        }
        j = iVar5;
      }
      iVar5 = (int)sVar10 + 2 + j + l2;
      if (0x100000 < iVar5) {
        ERR_put_error(0xb,0,0x87,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_obj.cc"
                      ,0x73);
        goto LAB_004c31e8;
      }
      if (gs_doit._8_8_ == 0) {
        if (ne._4_4_ + -1 < iVar5) break;
        q = (uchar *)(buf + l2);
      }
      else {
        iVar6 = BUF_MEM_grow((BUF_MEM *)gs_doit._8_8_,(long)(iVar5 + 1));
        if (CONCAT44(extraout_var_00,iVar6) == 0) goto LAB_004c31e8;
        q = (uchar *)(*(long *)(gs_doit._8_8_ + 8) + (long)l2);
      }
      puVar11 = q + 1;
      *q = '/';
      OPENSSL_memcpy(puVar11,p,sVar10 & 0xffffffff);
      q = puVar11 + (int)sVar10 + 1;
      puVar11[(int)sVar10] = '=';
      puVar11 = pXVar9->value->data;
      for (s._4_4_ = 0; (int)s._4_4_ < iVar4; s._4_4_ = s._4_4_ + 1) {
        if (gs_doit[(long)(int)(s._4_4_ & 3) + -2] != 0) {
          bVar1 = puVar11[(int)s._4_4_];
          uVar7 = (uint)bVar1;
          if ((uVar7 < 0x20) || (0x7e < uVar7)) {
            *q = '\\';
            q[1] = 'x';
            q[2] = "0123456789ABCDEF"[(int)uVar7 >> 4];
            q[3] = "0123456789ABCDEF"[(int)(uVar7 & 0xf)];
            q = q + 4;
          }
          else {
            *q = bVar1;
            q = q + 1;
          }
        }
      }
      *q = '\0';
      l2 = iVar5;
    }
    q = (uchar *)buf;
    if (gs_doit._8_8_ != 0) {
      q = *(uchar **)(gs_doit._8_8_ + 8);
      OPENSSL_free((void *)gs_doit._8_8_);
    }
    if (_lold == 0) {
      *q = '\0';
    }
    a_local = (X509_NAME *)q;
  }
  return (char *)a_local;
}

Assistant:

char *X509_NAME_oneline(const X509_NAME *a, char *buf, int len) {
  X509_NAME_ENTRY *ne;
  size_t i;
  int n, lold, l, l1, l2, num, j, type;
  const char *s;
  char *p;
  unsigned char *q;
  BUF_MEM *b = NULL;
  static const char hex[17] = "0123456789ABCDEF";
  int gs_doit[4];
  char tmp_buf[80];

  if (buf == NULL) {
    if ((b = BUF_MEM_new()) == NULL) {
      goto err;
    }
    if (!BUF_MEM_grow(b, 200)) {
      goto err;
    }
    b->data[0] = '\0';
    len = 200;
  } else if (len <= 0) {
    return NULL;
  }
  if (a == NULL) {
    if (b) {
      buf = b->data;
      OPENSSL_free(b);
    }
    OPENSSL_strlcpy(buf, "NO X509_NAME", len);
    return buf;
  }

  len--;  // space for '\0'
  l = 0;
  for (i = 0; i < sk_X509_NAME_ENTRY_num(a->entries); i++) {
    ne = sk_X509_NAME_ENTRY_value(a->entries, i);
    n = OBJ_obj2nid(ne->object);
    if ((n == NID_undef) || ((s = OBJ_nid2sn(n)) == NULL)) {
      i2t_ASN1_OBJECT(tmp_buf, sizeof(tmp_buf), ne->object);
      s = tmp_buf;
    }
    l1 = strlen(s);

    type = ne->value->type;
    num = ne->value->length;
    if (num > NAME_ONELINE_MAX) {
      OPENSSL_PUT_ERROR(X509, X509_R_NAME_TOO_LONG);
      goto err;
    }
    q = ne->value->data;

    if ((type == V_ASN1_GENERALSTRING) && ((num % 4) == 0)) {
      gs_doit[0] = gs_doit[1] = gs_doit[2] = gs_doit[3] = 0;
      for (j = 0; j < num; j++) {
        if (q[j] != 0) {
          gs_doit[j & 3] = 1;
        }
      }

      if (gs_doit[0] | gs_doit[1] | gs_doit[2]) {
        gs_doit[0] = gs_doit[1] = gs_doit[2] = gs_doit[3] = 1;
      } else {
        gs_doit[0] = gs_doit[1] = gs_doit[2] = 0;
        gs_doit[3] = 1;
      }
    } else {
      gs_doit[0] = gs_doit[1] = gs_doit[2] = gs_doit[3] = 1;
    }

    for (l2 = j = 0; j < num; j++) {
      if (!gs_doit[j & 3]) {
        continue;
      }
      l2++;
      if ((q[j] < ' ') || (q[j] > '~')) {
        l2 += 3;
      }
    }

    lold = l;
    l += 1 + l1 + 1 + l2;
    if (l > NAME_ONELINE_MAX) {
      OPENSSL_PUT_ERROR(X509, X509_R_NAME_TOO_LONG);
      goto err;
    }
    if (b != NULL) {
      if (!BUF_MEM_grow(b, l + 1)) {
        goto err;
      }
      p = &(b->data[lold]);
    } else if (l > len) {
      break;
    } else {
      p = &(buf[lold]);
    }
    *(p++) = '/';
    OPENSSL_memcpy(p, s, (unsigned int)l1);
    p += l1;
    *(p++) = '=';

    q = ne->value->data;

    for (j = 0; j < num; j++) {
      if (!gs_doit[j & 3]) {
        continue;
      }
      n = q[j];
      if ((n < ' ') || (n > '~')) {
        *(p++) = '\\';
        *(p++) = 'x';
        *(p++) = hex[(n >> 4) & 0x0f];
        *(p++) = hex[n & 0x0f];
      } else {
        *(p++) = n;
      }
    }
    *p = '\0';
  }
  if (b != NULL) {
    p = b->data;
    OPENSSL_free(b);
  } else {
    p = buf;
  }
  if (i == 0) {
    *p = '\0';
  }
  return p;
err:
  BUF_MEM_free(b);
  return NULL;
}